

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command_conflict *commands,
               size_t n_commands,uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,
               uint16_t *cmd_bits,uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,
               uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (n_commands != 0) {
    sVar10 = 0;
    do {
      uVar11 = commands[sVar10].insert_len_;
      uVar12 = (ulong)uVar11;
      uVar4 = commands[sVar10].copy_len_;
      uVar2 = commands[sVar10].cmd_prefix_;
      bVar1 = cmd_depth[uVar2];
      uVar17 = *storage_ix;
      uVar5 = commands[sVar10].dist_extra_;
      uVar3 = commands[sVar10].dist_prefix_;
      *(ulong *)(storage + (uVar17 >> 3)) =
           (ulong)cmd_bits[uVar2] << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
      uVar17 = bVar1 + uVar17;
      *storage_ix = uVar17;
      uVar8 = uVar11;
      if (5 < uVar12) {
        if (uVar11 < 0x82) {
          uVar8 = 0x1f;
          uVar14 = (uint)(uVar12 - 2);
          if (uVar14 != 0) {
            for (; uVar14 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = (int)(uVar12 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                  (uVar8 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar11 < 0x842) {
          uVar8 = 0x1f;
          if (uVar11 - 0x42 != 0) {
            for (; uVar11 - 0x42 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = (uVar8 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar8 = 0x15;
          if (0x1841 < uVar11) {
            uVar8 = 0x17 - (uVar11 < 0x5842);
          }
        }
      }
      bVar1 = (byte)(uVar4 >> 0x18);
      uVar14 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + (uVar4 & 0x1ffffff);
      if (uVar14 < 10) {
        uVar15 = uVar14 + 0xfffe;
      }
      else if (uVar14 < 0x86) {
        uVar15 = 0x1f;
        uVar13 = (uint)((ulong)uVar14 - 6);
        if (uVar13 != 0) {
          for (; uVar13 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        uVar15 = (uVar15 ^ 0xffffffe0) * 2 +
                 (int)((ulong)uVar14 - 6 >> ((char)(uVar15 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x42;
      }
      else {
        uVar15 = 0x17;
        if (uVar14 < 0x846) {
          uVar15 = 0x1f;
          if (uVar14 - 0x46 != 0) {
            for (; uVar14 - 0x46 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          uVar15 = (uVar15 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar9 = (ulong)((uVar8 & 0xffff) << 2);
      iVar6 = *(int *)((long)kInsExtra + uVar9);
      uVar16 = (ulong)((uVar15 & 0xffff) << 2);
      iVar7 = *(int *)((long)kCopyExtra + uVar16);
      *(ulong *)(storage + (uVar17 >> 3)) =
           ((ulong)(uVar14 - *(int *)((long)kCopyBase + uVar16)) << ((byte)iVar6 & 0x3f) |
           (ulong)(uVar11 - *(int *)((long)kInsBase + uVar9))) << ((byte)uVar17 & 7) |
           (ulong)storage[uVar17 >> 3];
      *storage_ix = (uint)(iVar6 + iVar7) + uVar17;
      if (uVar12 != 0) {
        uVar17 = *storage_ix;
        do {
          bVar1 = lit_depth[input[start_pos & mask]];
          *(ulong *)(storage + (uVar17 >> 3)) =
               (ulong)lit_bits[input[start_pos & mask]] << ((byte)uVar17 & 7) |
               (ulong)storage[uVar17 >> 3];
          uVar17 = uVar17 + bVar1;
          *storage_ix = uVar17;
          start_pos = start_pos + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      if (((uVar4 & 0x1ffffff) != 0) && (0x7f < uVar2)) {
        uVar11 = uVar3 & 0x3ff;
        uVar17 = *storage_ix;
        uVar12 = dist_depth[uVar11] + uVar17;
        *(ulong *)(storage + (uVar17 >> 3)) =
             (ulong)dist_bits[uVar11] << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
        *storage_ix = uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)uVar5 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        *storage_ix = uVar12 + (uVar3 >> 10);
      }
      start_pos = start_pos + (uVar4 & 0x1ffffff);
      sVar10 = sVar10 + 1;
    } while (sVar10 != n_commands);
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command* commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_ & 0x3FF;
      const uint32_t distnumextra = cmd.dist_prefix_ >> 10;
      const uint32_t distextra = cmd.dist_extra_;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}